

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCleanLevels(Gia_Man_t *p,int Size)

{
  Vec_Int_t *p_00;
  
  p_00 = p->vLevels;
  if (p_00 == (Vec_Int_t *)0x0) {
    p_00 = Vec_IntAlloc(Size);
    p->vLevels = p_00;
  }
  Vec_IntFill(p_00,Size,0);
  return;
}

Assistant:

void Gia_ManCleanLevels( Gia_Man_t * p, int Size )
{
    if ( p->vLevels == NULL )
        p->vLevels = Vec_IntAlloc( Size );
    Vec_IntFill( p->vLevels, Size, 0 );
}